

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O0

int getSurfaceHeight(double *ncol00,double *ncol01,double *ncol10,double *ncol11,int colymin,
                    int colymax,int blockspercell,double dx,double dz)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  double noise;
  double dy;
  double v111;
  double v110;
  double v011;
  double v010;
  double v101;
  double v100;
  double v001;
  double v000;
  int idx;
  int celly;
  int y;
  double in_stack_ffffffffffffff60;
  double dz_00;
  double dy_00;
  double dx_00;
  double v110_00;
  double v011_00;
  double v111_00;
  int local_48;
  int local_44;
  
  local_48 = in_R9D + -1;
  do {
    if (local_48 < in_R8D) {
      return 0;
    }
    iVar1 = local_48 - in_R8D;
    v111_00 = *(double *)(in_RSI + (long)iVar1 * 8);
    v011_00 = *(double *)(in_RDX + (long)iVar1 * 8);
    v110_00 = *(double *)(in_RCX + (long)iVar1 * 8);
    dx_00 = *(double *)(in_RSI + (long)(iVar1 + 1) * 8);
    dy_00 = *(double *)(in_RDX + (long)(iVar1 + 1) * 8);
    dz_00 = *(double *)(in_RCX + (long)(iVar1 + 1) * 8);
    local_44 = in_stack_00000008;
    while (local_44 = local_44 + -1, -1 < local_44) {
      in_stack_ffffffffffffff60 =
           lerp3(dx_00,dy_00,dz_00,(double)local_44 / (double)in_stack_00000008,
                 in_stack_ffffffffffffff60,dz_00,v110_00,dx_00,v110_00,v011_00,v111_00);
      if (0.0 < in_stack_ffffffffffffff60) {
        return local_48 * in_stack_00000008 + local_44;
      }
    }
    local_48 = local_48 + -1;
  } while( true );
}

Assistant:

int getSurfaceHeight(
        const double ncol00[], const double ncol01[],
        const double ncol10[], const double ncol11[],
        int colymin, int colymax, int blockspercell, double dx, double dz)
{
    int y, celly;
    for (celly = colymax-1; celly >= colymin; celly--)
    {
        int idx = celly - colymin;
        double v000 = ncol00[idx];
        double v001 = ncol01[idx];
        double v100 = ncol10[idx];
        double v101 = ncol11[idx];
        double v010 = ncol00[idx+1];
        double v011 = ncol01[idx+1];
        double v110 = ncol10[idx+1];
        double v111 = ncol11[idx+1];

        for (y = blockspercell - 1; y >= 0; y--)
        {
            double dy = y / (double) blockspercell;
            double noise = lerp3(dy, dx, dz, // Note: not x, y, z
                v000, v010, v100, v110,
                v001, v011, v101, v111);
            if (noise > 0)
                return celly * blockspercell + y;
        }
    }
    return 0;
}